

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.h
# Opt level: O2

wav_basis_norms_static<16> * idx2::GetCdf53NormsFast<16>(void)

{
  wav_basis_norms_static<16> *in_RDI;
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  double dVar7;
  
  (in_RDI->ScalNorms).Len = '\0';
  auVar3 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])((in_RDI->ScalNorms).Arr + 0xc) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((in_RDI->ScalNorms).Arr + 8) = ZEXT1632(auVar3);
  auVar6 = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((in_RDI->ScalNorms).Arr + 4) = auVar6;
  *(undefined1 (*) [32])(in_RDI->ScalNorms).Arr = auVar6;
  *(undefined1 (*) [32])(in_RDI->WaveNorms).Arr = auVar6;
  *(undefined1 (*) [32])((in_RDI->WaveNorms).Arr + 4) = auVar6;
  *(undefined1 (*) [32])((in_RDI->WaveNorms).Arr + 8) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((in_RDI->WaveNorms).Arr + 0xc) = ZEXT1632(auVar3);
  (in_RDI->WaveNorms).Len = '\0';
  auVar3 = _DAT_00199c50;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    auVar4._0_8_ = auVar3._0_8_ / (double)(2 << ((byte)lVar1 & 0x1f));
    dVar7 = auVar3._8_8_;
    auVar4._8_8_ = dVar7;
    if (auVar4._0_8_ < 0.0) {
      dVar2 = sqrt(auVar4._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar4,auVar4);
      dVar2 = auVar4._0_8_;
    }
    (in_RDI->ScalNorms).Arr[lVar1] = dVar2;
    auVar4 = vshufpd_avx(auVar3,auVar3,1);
    auVar5._0_8_ = auVar4._0_8_ / (double)(0x20 << ((byte)lVar1 & 0x1f));
    auVar5._8_8_ = auVar4._8_8_;
    if (auVar5._0_8_ < 0.0) {
      dVar2 = sqrt(auVar5._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar5,auVar5);
      dVar2 = auVar4._0_8_;
    }
    (in_RDI->WaveNorms).Arr[lVar1] = dVar2;
    auVar3._0_8_ = auVar3._0_8_ * 4.0 + -1.0;
    auVar3._8_8_ = dVar7 * 4.0 + -33.0;
  }
  return in_RDI;
}

Assistant:

wav_basis_norms_static<N>
GetCdf53NormsFast()
{
  wav_basis_norms_static<N> Result;
  f64 Num1 = 3, Num2 = 23;
  for (int I = 0; I < N; ++I)
  {
    Result.ScalNorms[I] = sqrt(Num1 / (1 << (I + 1)));
    Num1 = Num1 * 4 - 1;
    Result.WaveNorms[I] = sqrt(Num2 / (1 << (I + 5)));
    Num2 = Num2 * 4 - 33;
  }
  return Result;
}